

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

int secp256k1_musig_session_load
              (secp256k1_context *ctx,secp256k1_musig_session_internal *session_i,
              secp256k1_musig_session *session)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  uchar *p1;
  
  lVar4 = 0;
  do {
    iVar5 = (uint)session->data[lVar4] - (uint)secp256k1_musig_session_cache_magic[lVar4];
    if (session->data[lVar4] != secp256k1_musig_session_cache_magic[lVar4]) goto LAB_0011400c;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  iVar5 = 0;
LAB_0011400c:
  if (iVar5 != 0) {
    secp256k1_musig_session_load_cold_1();
  }
  else {
    session_i->fin_nonce_parity = (uint)session->data[4];
    uVar1 = *(undefined8 *)(session->data + 0xd);
    uVar2 = *(undefined8 *)(session->data + 0x15);
    uVar3 = *(undefined8 *)(session->data + 0x1d);
    *(undefined8 *)session_i->fin_nonce = *(undefined8 *)(session->data + 5);
    *(undefined8 *)(session_i->fin_nonce + 8) = uVar1;
    *(undefined8 *)(session_i->fin_nonce + 0x10) = uVar2;
    *(undefined8 *)(session_i->fin_nonce + 0x18) = uVar3;
    secp256k1_scalar_set_b32(&session_i->noncecoef,session->data + 0x25,(int *)0x0);
    secp256k1_scalar_set_b32(&session_i->challenge,session->data + 0x45,(int *)0x0);
    secp256k1_scalar_set_b32(&session_i->s_part,session->data + 0x65,(int *)0x0);
  }
  return (uint)(iVar5 == 0);
}

Assistant:

static int secp256k1_musig_session_load(const secp256k1_context* ctx, secp256k1_musig_session_internal *session_i, const secp256k1_musig_session *session) {
    const unsigned char *ptr = session->data;

    ARG_CHECK(secp256k1_memcmp_var(ptr, secp256k1_musig_session_cache_magic, 4) == 0);
    ptr += 4;
    session_i->fin_nonce_parity = *ptr;
    ptr += 1;
    memcpy(session_i->fin_nonce, ptr, 32);
    ptr += 32;
    secp256k1_scalar_set_b32(&session_i->noncecoef, ptr, NULL);
    ptr += 32;
    secp256k1_scalar_set_b32(&session_i->challenge, ptr, NULL);
    ptr += 32;
    secp256k1_scalar_set_b32(&session_i->s_part, ptr, NULL);
    return 1;
}